

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

uchar __thiscall Map::GenerateNPCIndex(Map *this)

{
  bool bVar1;
  reference ppNVar2;
  NPC *npc;
  const_iterator __end1;
  const_iterator __begin1;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range1;
  uchar lowest_free_id;
  Map *this_local;
  
  __range1._7_1_ = '\x01';
  do {
    __end1 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(&this->npcs);
    npc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(&this->npcs);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<NPC_*const_*,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                                  *)&npc);
      if (!bVar1) {
        return __range1._7_1_;
      }
      ppNVar2 = __gnu_cxx::
                __normal_iterator<NPC_*const_*,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
                operator*(&__end1);
      if ((*ppNVar2)->index == __range1._7_1_) break;
      __gnu_cxx::__normal_iterator<NPC_*const_*,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
      operator++(&__end1);
    }
    __range1._7_1_ = (*ppNVar2)->index + '\x01';
  } while( true );
}

Assistant:

unsigned char Map::GenerateNPCIndex() const
{
	unsigned char lowest_free_id = 1;
	restart_loop:
	UTIL_FOREACH(this->npcs, npc)
	{
		if (npc->index == lowest_free_id)
		{
			lowest_free_id = npc->index + 1;
			goto restart_loop;
		}
	}
	return lowest_free_id;
}